

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O3

bool __thiscall
Rml::Context::ProcessMouseButtonUp(Context *this,int button_index,int key_modifier_state)

{
  Element *pEVar1;
  pointer ppEVar2;
  bool bVar3;
  Element *pEVar4;
  pointer ppEVar5;
  Context *pCVar6;
  char *__end;
  bool bVar7;
  Dictionary drag_parameters;
  Dictionary parameters;
  String local_78;
  Dictionary local_58;
  Context *local_38;
  
  local_58.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar6 = this;
  GenerateMouseEventParameters(this,&local_58,button_index);
  GenerateKeyModifierEventParameters(pCVar6,&local_58,key_modifier_state);
  pEVar1 = (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
           super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  pEVar4 = this->hover;
  if ((pEVar4 == pEVar1 || pEVar4 == (Element *)0x0) &&
     (this->active == pEVar1 || this->active == (Element *)0x0)) {
    bVar7 = ((this->scroll_controller)._M_t.
             super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
             ._M_t.
             super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
             .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl)->mode !=
            Autoscroll;
  }
  else {
    bVar7 = false;
  }
  if (button_index == 0) {
    if (pEVar4 != (Element *)0x0) {
      Element::DispatchEvent(pEVar4,Mouseup,&local_58);
      if ((this->hover != (Element *)0x0) && (pEVar1 = this->active, pEVar1 != (Element *)0x0)) {
        pEVar4 = FindFocusElement(this->hover);
        if (pEVar1 == pEVar4) {
          Element::DispatchEvent(this->active,Click,&local_58);
        }
      }
    }
    ppEVar5 = (this->active_chain).
              super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppEVar2 = (this->active_chain).
              super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppEVar5 != ppEVar2) {
      local_38 = this;
      do {
        pEVar1 = *ppEVar5;
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"active","");
        Element::SetPseudoClass(pEVar1,&local_78,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        ppEVar5 = ppEVar5 + 1;
      } while (ppEVar5 != ppEVar2);
      ppEVar5 = (local_38->active_chain).
                super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      this = local_38;
      if ((local_38->active_chain).
          super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppEVar5) {
        (local_38->active_chain).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppEVar5;
      }
    }
    this->active = (Element *)0x0;
    if (this->drag != (Element *)0x0) {
      if (this->drag_started == true) {
        local_78._M_dataplus._M_p = (pointer)0x0;
        local_78._M_string_length = 0;
        local_78.field_2._M_allocated_capacity = 0;
        GenerateMouseEventParameters(this,(Dictionary *)&local_78,-1);
        pCVar6 = this;
        GenerateDragEventParameters(this,(Dictionary *)&local_78);
        GenerateKeyModifierEventParameters(pCVar6,(Dictionary *)&local_78,key_modifier_state);
        if ((this->drag_hover != (Element *)0x0) && (this->drag_verbose == true)) {
          Element::DispatchEvent(this->drag_hover,Dragdrop,(Dictionary *)&local_78);
          if (this->drag_hover != (Element *)0x0) {
            Element::DispatchEvent(this->drag_hover,Dragout,(Dictionary *)&local_78);
          }
        }
        if (this->drag != (Element *)0x0) {
          Element::DispatchEvent(this->drag,Dragend,(Dictionary *)&local_78);
        }
        ReleaseDragClone(this);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                   *)&local_78);
      }
      this->drag = (Element *)0x0;
      this->drag_hover = (Element *)0x0;
      ppEVar5 = (this->drag_hover_chain).m_container.
                super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->drag_hover_chain).m_container.
          super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppEVar5) {
        (this->drag_hover_chain).m_container.
        super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppEVar5;
      }
      ProcessMouseMove(this,(this->mouse_position).x,(this->mouse_position).y,key_modifier_state);
    }
  }
  else if (pEVar4 != (Element *)0x0) {
    Element::DispatchEvent(pEVar4,Mouseup,&local_58);
  }
  bVar3 = ScrollController::HasAutoscrollMoved
                    ((this->scroll_controller)._M_t.
                     super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
                     .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl);
  if (bVar3) {
    ScrollController::Reset
              ((this->scroll_controller)._M_t.
               super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
               ._M_t.
               super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
               .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl);
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_58.m_container);
  return bVar7;
}

Assistant:

bool Context::ProcessMouseButtonUp(int button_index, int key_modifier_state)
{
	Dictionary parameters;
	GenerateMouseEventParameters(parameters, button_index);
	GenerateKeyModifierEventParameters(parameters, key_modifier_state);

	// We want to return the interaction state before handling the mouse up events, so that any active element that is released is considered to
	// capture the event.
	const bool result = !IsMouseInteracting();

	// Process primary click.
	if (button_index == 0)
	{
		// The elements in the new hover chain have the 'onmouseup' event called on them.
		if (hover)
			hover->DispatchEvent(EventId::Mouseup, parameters);

		// If the active element (the one that was being hovered over when the mouse button was pressed) is still being
		// hovered over, we click it.
		if (hover && active && active == FindFocusElement(hover))
		{
			active->DispatchEvent(EventId::Click, parameters);
		}

		// Unset the 'active' pseudo-class on all the elements in the active chain; because they may not necessarily
		// have had 'onmouseup' called on them, we can't guarantee this has happened already.
		for (Element* element : active_chain)
			element->SetPseudoClass("active", false);
		active_chain.clear();
		active = nullptr;

		if (drag)
		{
			if (drag_started)
			{
				Dictionary drag_parameters;
				GenerateMouseEventParameters(drag_parameters);
				GenerateDragEventParameters(drag_parameters);
				GenerateKeyModifierEventParameters(drag_parameters, key_modifier_state);

				if (drag_hover)
				{
					if (drag_verbose)
					{
						drag_hover->DispatchEvent(EventId::Dragdrop, drag_parameters);
						// User may have removed the element, do an extra check.
						if (drag_hover)
							drag_hover->DispatchEvent(EventId::Dragout, drag_parameters);
					}
				}

				if (drag)
					drag->DispatchEvent(EventId::Dragend, drag_parameters);

				ReleaseDragClone();
			}

			drag = nullptr;
			drag_hover = nullptr;
			drag_hover_chain.clear();

			// We may have changes under our mouse, this ensures that the hover chain is properly updated
			ProcessMouseMove(mouse_position.x, mouse_position.y, key_modifier_state);
		}
	}
	else
	{
		// Not the left mouse button, so we're not doing any special processing.
		if (hover)
			hover->DispatchEvent(EventId::Mouseup, parameters);
	}

	// If we have autoscrolled while holding the middle mouse button, release the autoscroll mode now.
	if (scroll_controller->HasAutoscrollMoved())
		scroll_controller->Reset();

	return result;
}